

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O3

ValueHolder * __thiscall
testing::internal::
ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
::DefaultValueHolderFactory::MakeNewHolder(DefaultValueHolderFactory *this)

{
  ValueHolder *pVVar1;
  
  pVVar1 = (ValueHolder *)operator_new(0x20);
  (pVVar1->super_ThreadLocalValueHolderBase)._vptr_ThreadLocalValueHolderBase =
       (_func_int **)&PTR__ValueHolder_00165bf8;
  (pVVar1->value_).
  super__Vector_base<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pVVar1->value_).
  super__Vector_base<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pVVar1->value_).
  super__Vector_base<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return pVVar1;
}

Assistant:

virtual ValueHolder* MakeNewHolder() const { return new ValueHolder(); }